

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

Totals * __thiscall Catch::Runner::runTests(Totals *__return_storage_ptr__,Runner *this)

{
  size_t *psVar1;
  size_type sVar2;
  pointer pTVar3;
  size_t sVar4;
  int iVar5;
  undefined4 extraout_var;
  TestSpecParser *this_00;
  IRegistryHub *pIVar6;
  undefined4 extraout_var_00;
  iterator iVar7;
  undefined4 extraout_var_01;
  _Alloc_hider __k;
  pointer pTVar8;
  TestSpec testSpec;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> testCases;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> skippedTestCases;
  RunContext context;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_380;
  string local_368;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> local_348;
  Ptr<Catch::IStreamingReporter> *local_328;
  undefined1 local_320 [32];
  size_type local_300;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8;
  vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
  local_2e8;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> vStack_2d0;
  TagAliasRegistry *local_2b8;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_2b0;
  RunContext local_298;
  
  local_320._0_8_ = (this->m_config).m_p;
  if ((Config *)local_320._0_8_ != (Config *)0x0) {
    (*(((Config *)local_320._0_8_)->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
      super_NonCopyable._vptr_NonCopyable[2])();
  }
  local_328 = &this->m_reporter;
  RunContext::RunContext(&local_298,(Ptr<const_Catch::IConfig> *)local_320,local_328);
  if ((Config *)local_320._0_8_ != (Config *)0x0) {
    (**(code **)((long)*(IShared *)local_320._0_8_ + 0x18))();
  }
  (__return_storage_ptr__->testCases).failed = 0;
  (__return_storage_ptr__->testCases).failedButOk = 0;
  (__return_storage_ptr__->assertions).failedButOk = 0;
  (__return_storage_ptr__->testCases).passed = 0;
  (__return_storage_ptr__->assertions).passed = 0;
  (__return_storage_ptr__->assertions).failed = 0;
  local_320._0_8_ = (IConfig *)(local_320 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"all tests","");
  RunContext::testGroupStarting(&local_298,(string *)local_320,1,1);
  if ((IConfig *)local_320._0_8_ != (IConfig *)(local_320 + 0x10)) {
    operator_delete((void *)local_320._0_8_);
  }
  iVar5 = (*(((this->m_config).m_p)->super_SharedImpl<Catch::IConfig>).super_IConfig.super_IShared.
            super_NonCopyable._vptr_NonCopyable[0xd])();
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
            (&local_380,
             (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
             CONCAT44(extraout_var,iVar5));
  if (local_380.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_380.
      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    TagAliasRegistry::get();
    local_300 = 0;
    local_2f8._M_local_buf[0] = '\0';
    local_2e8.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2e8.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2e8.
    super__Vector_base<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    vStack_2d0.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_2d0.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_2d0.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2b8 = &TagAliasRegistry::get::instance;
    local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
    local_320._24_8_ = &local_2f8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"~[.]","");
    this_00 = TestSpecParser::parse((TestSpecParser *)local_320,&local_368);
    TestSpecParser::addFilter(this_00);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
              (&local_2b0,&(this_00->m_testSpec).m_filters);
    local_348.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)local_380.
                  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_348.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)local_380.
                  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_348.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)local_380.
                  super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_380.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start =
         local_2b0.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_start;
    local_380.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         local_2b0.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_380.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_2b0.
         super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_2b0.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b0.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b0.super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              ((vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
               &local_348);
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&local_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p);
    }
    std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
              (&vStack_2d0);
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::~vector(&local_2e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._24_8_ != &local_2f8) {
      operator_delete((void *)local_320._24_8_);
    }
  }
  local_368._M_dataplus._M_p = (pointer)0x0;
  local_368._M_string_length = 0;
  local_368.field_2._M_allocated_capacity = 0;
  pIVar6 = getRegistryHub();
  iVar5 = (*pIVar6->_vptr_IRegistryHub[3])(pIVar6);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x18))
            ((long *)CONCAT44(extraout_var_00,iVar5),&local_380,(this->m_config).m_p,&local_368,0);
  sVar2 = local_368._M_string_length;
  if (local_368._M_dataplus._M_p != (pointer)local_368._M_string_length) {
    __k._M_p = local_368._M_dataplus._M_p;
    do {
      iVar7 = std::
              _Rb_tree<Catch::TestCase,_Catch::TestCase,_std::_Identity<Catch::TestCase>,_std::less<Catch::TestCase>,_std::allocator<Catch::TestCase>_>
              ::find(&(this->m_testsAlreadyRun)._M_t,(key_type *)__k._M_p);
      sVar4 = local_298.m_totals.assertions.failed;
      if ((_Rb_tree_header *)iVar7._M_node ==
          &(this->m_testsAlreadyRun)._M_t._M_impl.super__Rb_tree_header) {
        iVar5 = (*((local_298.m_config.m_p)->super_IShared).super_NonCopyable._vptr_NonCopyable[10])
                          ();
        if (sVar4 == (long)iVar5) break;
        RunContext::runTest((Totals *)local_320,&local_298,(TestCase *)__k._M_p);
        (__return_storage_ptr__->assertions).passed =
             (size_t)(local_320._0_8_ + (__return_storage_ptr__->assertions).passed);
        psVar1 = &(__return_storage_ptr__->assertions).failed;
        *psVar1 = *psVar1 + local_320._8_8_;
        psVar1 = &(__return_storage_ptr__->assertions).failedButOk;
        *psVar1 = *psVar1 + local_320._16_8_;
        (__return_storage_ptr__->testCases).passed =
             (size_t)((__return_storage_ptr__->testCases).passed + local_320._24_8_);
        psVar1 = &(__return_storage_ptr__->testCases).failed;
        *psVar1 = *psVar1 + local_300;
        psVar1 = &(__return_storage_ptr__->testCases).failedButOk;
        *psVar1 = *psVar1 + CONCAT71(local_2f8._M_allocated_capacity._1_7_,local_2f8._M_local_buf[0]
                                    );
        std::
        _Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
        ::_M_insert_unique<Catch::TestCase_const&>
                  ((_Rb_tree<Catch::TestCase,Catch::TestCase,std::_Identity<Catch::TestCase>,std::less<Catch::TestCase>,std::allocator<Catch::TestCase>>
                    *)&this->m_testsAlreadyRun,(TestCase *)__k._M_p);
      }
      __k._M_p = __k._M_p + 0x118;
    } while (__k._M_p != (pointer)sVar2);
  }
  local_348.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar6 = getRegistryHub();
  iVar5 = (*pIVar6->_vptr_IRegistryHub[3])(pIVar6);
  (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x18))
            ((long *)CONCAT44(extraout_var_01,iVar5),&local_380,(this->m_config).m_p,&local_348,1);
  pTVar3 = local_348.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar8 = local_348.super__Vector_base<Catch::TestCase,_std::allocator<Catch::TestCase>_>.
                _M_impl.super__Vector_impl_data._M_start; pTVar8 != pTVar3; pTVar8 = pTVar8 + 1) {
    (*(local_328->m_p->super_IShared).super_NonCopyable._vptr_NonCopyable[0x10])
              (local_328->m_p,pTVar8);
  }
  local_320._0_8_ = (IConfig *)(local_320 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"all tests","");
  RunContext::testGroupEnded(&local_298,(string *)local_320,__return_storage_ptr__,1,1);
  if ((IConfig *)local_320._0_8_ != (IConfig *)(local_320 + 0x10)) {
    operator_delete((void *)local_320._0_8_);
  }
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector(&local_348);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::~vector
            ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)&local_368);
  std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
            (&local_380);
  RunContext::~RunContext(&local_298);
  return __return_storage_ptr__;
}

Assistant:

Totals runTests() {

            RunContext context( m_config.get(), m_reporter );

            Totals totals;

            context.testGroupStarting( "all tests", 1, 1 ); // deprecated?

            TestSpec testSpec = m_config->testSpec();
            if( !testSpec.hasFilters() )
                testSpec = TestSpecParser( ITagAliasRegistry::get() ).parse( "~[.]" ).testSpec(); // All not hidden tests

            std::vector<TestCase> testCases;
            getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, *m_config, testCases );

            int testsRunForGroup = 0;
            for( std::vector<TestCase>::const_iterator it = testCases.begin(), itEnd = testCases.end();
                    it != itEnd;
                    ++it ) {
                testsRunForGroup++;
                if( m_testsAlreadyRun.find( *it ) == m_testsAlreadyRun.end() ) {

                    if( context.aborting() )
                        break;

                    totals += context.runTest( *it );
                    m_testsAlreadyRun.insert( *it );
                }
            }
            std::vector<TestCase> skippedTestCases;
            getRegistryHub().getTestCaseRegistry().getFilteredTests( testSpec, *m_config, skippedTestCases, true );

            for( std::vector<TestCase>::const_iterator it = skippedTestCases.begin(), itEnd = skippedTestCases.end();
                    it != itEnd;
                    ++it )
                m_reporter->skipTest( *it );

            context.testGroupEnded( "all tests", totals, 1, 1 );
            return totals;
        }